

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::compute::anon_unknown_0::SharedVarTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SharedVarTestInstance *this)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  Allocation *pAVar1;
  WriteDescriptorInfo *commandBuffer;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  const_iterator cVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  VkDeviceSize bufferSize;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  VkBufferMemoryBarrier computeFinishBarrier;
  WriteDescriptorInfo *local_328;
  long *plStack_320;
  pointer local_318;
  pointer pVStack_310;
  VkQueue local_300;
  WriteDescriptorInfo *local_2f8;
  long *plStack_2f0;
  pointer local_2e8;
  pointer pVStack_2e0;
  VkPipelineLayout local_2d8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_2d0;
  VkDescriptorSetLayout local_2b8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2b0;
  long *local_298;
  long local_290;
  long local_288 [2];
  VkCommandPool local_278;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_270;
  VkPipeline local_258;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_250;
  VkShaderModule local_238;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_230;
  VkDescriptorPool local_218;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_210;
  VkDescriptorBufferInfo descriptorInfo;
  Buffer local_1d8;
  ostringstream msg;
  WriteDescriptorInfo local_198;
  ios_base local_138 [264];
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_300 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  uVar10 = (this->m_localSize).m_data[1] * (this->m_localSize).m_data[0] *
           (this->m_localSize).m_data[2];
  iVar4 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] * (this->m_workSize).m_data[2]
  ;
  bufferSize = (long)iVar4 * (long)(int)uVar10 * 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,bufferSize,0x20);
  compute::Buffer::Buffer
            (&local_1d8,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&msg);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&msg,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
                       (VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&computeFinishBarrier,this_01,vk,device,0);
  DStack_2b0.m_device = (VkDevice)computeFinishBarrier._16_8_;
  DStack_2b0.m_allocator = (VkAllocationCallbacks *)computeFinishBarrier._24_8_;
  local_2b8.m_internal = computeFinishBarrier._0_8_;
  DStack_2b0.m_deviceIface = (DeviceInterface *)computeFinishBarrier.pNext;
  computeFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  computeFinishBarrier._4_4_ = 0;
  computeFinishBarrier.pNext = (void *)0x0;
  computeFinishBarrier.srcAccessMask = 0;
  computeFinishBarrier.dstAccessMask = 0;
  computeFinishBarrier.srcQueueFamilyIndex = 0;
  computeFinishBarrier.dstQueueFamilyIndex = 0;
  if ((pointer)local_198.bufferInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_198.bufferInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_198.texelBufferViews.
                          super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_198.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_198.imageInfos.
               super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_198.imageInfos.
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_198.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_198.imageInfos.
                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)_msg != (pointer)0x0) {
    operator_delete((void *)_msg,
                    (long)local_198.imageInfos.
                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start - _msg);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&computeFinishBarrier)
  ;
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&computeFinishBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&msg,this_02,vk,device,1,1);
  DStack_210.m_device =
       (VkDevice)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_210.m_allocator =
       (VkAllocationCallbacks *)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_218.m_internal = _msg;
  _msg = 0;
  local_198.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (computeFinishBarrier._0_8_ != 0) {
    operator_delete((void *)computeFinishBarrier._0_8_,
                    computeFinishBarrier._16_8_ - computeFinishBarrier._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&msg,vk,device,local_218,local_2b8);
  local_318 = (pointer)local_198.imageInfos.
                       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  pVStack_310 = (pointer)local_198.imageInfos.
                         super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_328 = (WriteDescriptorInfo *)_msg;
  plStack_320 = (long *)0x0;
  descriptorInfo.buffer.m_internal =
       local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorInfo.offset = 0;
  descriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&msg);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&msg,(int)local_328,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk,device);
  if ((pointer)local_198.bufferInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_198.bufferInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_198.texelBufferViews.
                          super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_198.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_198.imageInfos.
               super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_198.imageInfos.
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_198.bufferInfos.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_198.imageInfos.
                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&msg);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  computeFinishBarrier._0_8_ = &computeFinishBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&computeFinishBarrier,"comp","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this_00,(key_type *)&computeFinishBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&msg,vk,device,
             *(ProgramBinary **)(cVar2._M_node + 2),0);
  DStack_230.m_device =
       (VkDevice)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_230.m_allocator =
       (VkAllocationCallbacks *)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_238.m_internal = _msg;
  DStack_230.m_deviceIface = (DeviceInterface *)0x0;
  _msg = 0;
  local_198.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.imageInfos.
  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((VkAccessFlags *)computeFinishBarrier._0_8_ != &computeFinishBarrier.srcAccessMask) {
    operator_delete((void *)computeFinishBarrier._0_8_,computeFinishBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&msg,vk,device,local_2b8);
  DStack_2d0.m_device =
       (VkDevice)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_2d0.m_allocator =
       (VkAllocationCallbacks *)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2d8.m_internal = _msg;
  DStack_2d0.m_deviceIface = (DeviceInterface *)0x0;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&msg,vk,device,_msg,local_238);
  DStack_250.m_device =
       (VkDevice)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_250.m_allocator =
       (VkAllocationCallbacks *)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_258.m_internal = _msg;
  DStack_250.m_deviceIface = (DeviceInterface *)0x0;
  makeBufferMemoryBarrier
            (&computeFinishBarrier,0x40,0x2000,
             (VkBuffer)
             local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&msg,vk,device,queueFamilyIndex);
  DStack_270.m_device =
       (VkDevice)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  DStack_270.m_allocator =
       (VkAllocationCallbacks *)
       local_198.imageInfos.
       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_278.m_internal = _msg;
  DStack_270.m_deviceIface = (DeviceInterface *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&msg,vk,device,(VkCommandPool)_msg,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  commandBuffer = (WriteDescriptorInfo *)_msg;
  local_2e8 = (pointer)local_198.imageInfos.
                       super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  pVStack_2e0 = (pointer)local_198.imageInfos.
                         super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_2f8 = (WriteDescriptorInfo *)_msg;
  plStack_2f0 = (long *)0x0;
  beginCommandBuffer(vk,(VkCommandBuffer)_msg);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_258.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,1,local_2d8.m_internal,0,1,&local_328,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,commandBuffer,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1],(ulong)(uint)(this->m_workSize).m_data[2]);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x800,0x4000,0,0,0,1,&computeFinishBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(vk,device,local_300,(VkCommandBuffer)commandBuffer);
  pAVar1 = local_1d8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_1d8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_1d8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  if (0 < iVar4) {
    iVar5 = 0;
    iVar7 = 0;
    do {
      if (0 < (int)uVar10) {
        uVar8 = (ulong)uVar10;
        iVar6 = iVar5;
        do {
          iVar9 = (int)uVar8 + -1;
          if (*(int *)((long)pAVar1->m_hostPtr + (long)iVar6 * 4) != iVar9 * iVar9 + iVar7 * uVar10)
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&msg,"Comparison failed for Output.values[",0x24);
            poVar3 = (ostream *)std::ostream::operator<<(&msg,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
            std::__cxx11::stringbuf::str();
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_298,
                       local_290 + (long)local_298);
            if (local_298 != local_288) {
              operator_delete(local_298,local_288[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
            std::ios_base::~ios_base(local_138);
            goto LAB_006ea3a4;
          }
          iVar6 = iVar6 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      iVar7 = iVar7 + 1;
      iVar5 = iVar5 + uVar10;
    } while (iVar7 != iVar4);
  }
  _msg = (deUint64)&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Compute succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,_msg,_msg);
  if ((WriteDescriptorInfo *)_msg != &local_198) {
    operator_delete((void *)_msg,
                    (ulong)((long)&(((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                      *)&(local_198.imageInfos.
                                          super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->sampler)->
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_006ea3a4:
  if (commandBuffer != (WriteDescriptorInfo *)0x0) {
    _msg = (deUint64)commandBuffer;
    (**(code **)(*plStack_2f0 + 0x240))(plStack_2f0,local_2e8,pVStack_2e0,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_270,local_278);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_250,local_258);
  }
  if (local_2d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_2d0,local_2d8);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_230,local_238);
  }
  if (local_328 != (WriteDescriptorInfo *)0x0) {
    _msg = (deUint64)local_328;
    (**(code **)(*plStack_320 + 0x1e8))(plStack_320,local_318,pVStack_310,1);
  }
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_210,local_218);
  }
  if (local_2b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2b0,local_2b8);
  }
  if (local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_1d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_1d8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_1d8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SharedVarTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int workGroupSize = multiplyComponents(m_localSize);
	const int workGroupCount = multiplyComponents(m_workSize);

	// Create a buffer and host-visible memory for it

	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * workGroupSize * workGroupCount;
	const Buffer buffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*buffer, 0ull, bufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const VkBufferMemoryBarrier computeFinishBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *buffer, 0ull, bufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &computeFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& bufferAllocation = buffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(bufferAllocation.getHostPtr());

	for (int groupNdx = 0; groupNdx < workGroupCount; ++groupNdx)
	{
		const int globalOffset = groupNdx * workGroupSize;
		for (int localOffset = 0; localOffset < workGroupSize; ++localOffset)
		{
			const deUint32 res = bufferPtr[globalOffset + localOffset];
			const deUint32 ref = globalOffset + squared(workGroupSize - localOffset - 1);

			if (res != ref)
			{
				std::ostringstream msg;
				msg << "Comparison failed for Output.values[" << (globalOffset + localOffset) << "]";
				return tcu::TestStatus::fail(msg.str());
			}
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}